

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bson.c
# Opt level: O0

void test_bson_append_symbol(void)

{
  byte bVar1;
  bson_t *a;
  bson_t *b_00;
  bson_t *b2;
  bson_t *b;
  
  a = (bson_t *)bson_new();
  b_00 = get_bson("test32.bson");
  bVar1 = bson_append_symbol(a,"hello",0xffffffff,"world");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0xb8,"test_bson_append_symbol","bson_append_symbol (b, \"hello\", -1, \"world\", -1)");
    abort();
  }
  BSON_ASSERT_BSON_EQUAL(a,b_00);
  bson_destroy(a);
  bson_destroy(b_00);
  return;
}

Assistant:

static void
test_bson_append_symbol (void)
{
   bson_t *b;
   bson_t *b2;

   b = bson_new ();
   b2 = get_bson ("test32.bson");
   BSON_ASSERT (bson_append_symbol (b, "hello", -1, "world", -1));
   BSON_ASSERT_BSON_EQUAL (b, b2);
   bson_destroy (b);
   bson_destroy (b2);
}